

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageLoadStoreTests.cpp
# Opt level: O2

VkDescriptorSetLayout __thiscall
vkt::image::anon_unknown_0::ImageLoadStoreTestInstance::prepareDescriptors
          (ImageLoadStoreTestInstance *this)

{
  Move<vk::Handle<(vk::HandleType)19>_> *this_00;
  deUint32 numDescriptors;
  VkImageSubresourceRange subresourceRange;
  VkImageSubresourceRange subresourceRange_00;
  VkImageSubresourceRange subresourceRange_01;
  VkImageSubresourceRange subresourceRange_02;
  ImageType imageType;
  VkImageViewType VVar1;
  VkDevice device;
  DeviceInterface *vk;
  DescriptorSetLayoutBuilder *pDVar2;
  DescriptorPoolBuilder *pDVar3;
  ulong uVar4;
  undefined4 uVar5;
  ulong uVar6;
  ulong uVar7;
  RefBase<vk::Handle<(vk::HandleType)21>_> local_1f8;
  DescriptorSetLayoutBuilder local_1d8;
  RefBase<vk::Handle<(vk::HandleType)19>_> local_188;
  Move<vk::Handle<(vk::HandleType)19>_> *local_168;
  ulong local_160;
  undefined8 local_158;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  undefined4 local_148;
  undefined8 local_140;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 local_130;
  undefined8 local_128;
  undefined8 uStack_120;
  deUint32 local_118;
  undefined8 local_108;
  undefined8 uStack_100;
  deUint32 local_f8;
  RefBase<vk::Handle<(vk::HandleType)13>_> local_f0;
  RefBase<vk::Handle<(vk::HandleType)13>_> local_d0;
  RefBase<vk::Handle<(vk::HandleType)22>_> local_b0;
  RefBase<vk::Handle<(vk::HandleType)13>_> local_90;
  RefBase<vk::Handle<(vk::HandleType)22>_> local_70;
  RefBase<vk::Handle<(vk::HandleType)13>_> local_50;
  
  device = Context::getDevice((this->super_LoadStoreTestInstance).super_BaseTestInstance.
                              super_TestInstance.m_context);
  vk = Context::getDeviceInterface
                 ((this->super_LoadStoreTestInstance).super_BaseTestInstance.super_TestInstance.
                  m_context);
  numDescriptors = (this->super_LoadStoreTestInstance).super_BaseTestInstance.m_texture.m_numLayers;
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder(&local_1d8);
  pDVar2 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                     (&local_1d8,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,0x20);
  pDVar2 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                     (pDVar2,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,0x20);
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)&local_188,pDVar2,vk,device,0);
  local_1f8.m_data.deleter.m_device = local_188.m_data.deleter.m_device;
  local_1f8.m_data.deleter.m_allocator = local_188.m_data.deleter.m_allocator;
  local_1f8.m_data.object.m_internal = local_188.m_data.object.m_internal;
  local_1f8.m_data.deleter.m_deviceIface = local_188.m_data.deleter.m_deviceIface;
  local_188.m_data.object.m_internal = 0;
  local_188.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_188.m_data.deleter.m_device = (VkDevice)0x0;
  local_188.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  this_00 = &this->m_descriptorSetLayout;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::reset
            (&this_00->super_RefBase<vk::Handle<(vk::HandleType)19>_>);
  (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
  m_device = local_1f8.m_data.deleter.m_device;
  (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
  m_allocator = local_1f8.m_data.deleter.m_allocator;
  (this_00->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.m_internal =
       local_1f8.m_data.object.m_internal;
  (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
  m_deviceIface = local_1f8.m_data.deleter.m_deviceIface;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase(&local_188);
  ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder(&local_1d8);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&local_188);
  pDVar3 = ::vk::DescriptorPoolBuilder::addType
                     ((DescriptorPoolBuilder *)&local_188,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,
                      numDescriptors);
  pDVar3 = ::vk::DescriptorPoolBuilder::addType
                     (pDVar3,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,numDescriptors);
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&local_1f8,pDVar3,vk,device,1,numDescriptors);
  local_1d8.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_1f8.m_data.deleter.m_device;
  local_1d8.m_immutableSamplerInfos.
  super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_1f8.m_data.deleter.m_allocator;
  local_1d8.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_1f8.m_data.object.m_internal;
  local_1d8.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_1f8.m_data.deleter.m_deviceIface;
  local_1f8.m_data.object.m_internal = 0;
  local_1f8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_1f8.m_data.deleter.m_device = (VkDevice)0x0;
  local_1f8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::reset
            (&(this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>);
  (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device =
       (VkDevice)
       local_1d8.m_bindings.
       super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator
       = (VkAllocationCallbacks *)
         local_1d8.m_immutableSamplerInfos.
         super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
         ._M_impl.super__Vector_impl_data._M_start;
  (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal =
       (deUint64)
       local_1d8.m_bindings.
       super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
  m_deviceIface =
       (DeviceInterface *)
       local_1d8.m_bindings.
       super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase(&local_1f8);
  std::_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::
  ~_Vector_base((_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_> *
                )&local_188);
  local_168 = this_00;
  if ((this->super_LoadStoreTestInstance).super_BaseTestInstance.m_singleLayerBind == true) {
    uVar7 = 0;
    uVar4 = (ulong)numDescriptors;
    if ((int)numDescriptors < 1) {
      uVar4 = uVar7;
    }
    local_160 = uVar4;
    for (uVar6 = 0; uVar4 != uVar6; uVar6 = uVar6 + 1) {
      imageType = getImageTypeForSingleLayer
                            ((this->super_LoadStoreTestInstance).super_BaseTestInstance.m_texture.
                             m_type);
      VVar1 = mapImageViewType(imageType);
      makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&local_70,vk,device,
                        (VkDescriptorPool)
                        (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.
                        m_data.object.m_internal,
                        (VkDescriptorSetLayout)
                        (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>
                        .m_data.object.m_internal);
      makeVkSharedPtr<vk::Handle<(vk::HandleType)22>>
                ((image *)&local_1d8,(Move<vk::Handle<(vk::HandleType)22>_> *)&local_70);
      de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>::operator=
                ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_> *)
                 ((long)&((this->m_allDescriptorSets).
                          super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_ptr + uVar7),
                 (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_> *)&local_1d8);
      de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>::~SharedPtr
                ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_> *)&local_1d8);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase(&local_70);
      local_140 = 1;
      uStack_138 = 1;
      uVar5 = (undefined4)uVar6;
      subresourceRange.baseArrayLayer = uVar5;
      subresourceRange.levelCount = 1;
      subresourceRange.aspectMask = 1;
      subresourceRange.baseMipLevel = 0;
      subresourceRange.layerCount = 1;
      uStack_134 = uVar5;
      local_130 = uStack_138;
      makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)&local_90,vk,device,
                    (VkImage)(((this->m_imageSrc).
                               super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>
                               .m_data.ptr)->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                             m_data.object.m_internal,VVar1,
                    (this->super_LoadStoreTestInstance).super_BaseTestInstance.m_format,
                    subresourceRange);
      makeVkSharedPtr<vk::Handle<(vk::HandleType)13>>
                ((image *)&local_1d8,(Move<vk::Handle<(vk::HandleType)13>_> *)&local_90);
      de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::operator=
                ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_> *)
                 ((long)&((this->m_allSrcImageViews).
                          super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_ptr + uVar7),
                 (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_> *)&local_1d8);
      de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::release
                ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_> *)&local_1d8);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase(&local_90);
      local_158 = 1;
      uStack_150 = 1;
      subresourceRange_00.baseArrayLayer = uVar5;
      subresourceRange_00.levelCount = 1;
      subresourceRange_00.aspectMask = 1;
      subresourceRange_00.baseMipLevel = 0;
      subresourceRange_00.layerCount = 1;
      uStack_14c = uVar5;
      local_148 = uStack_150;
      makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)&local_50,vk,device,
                    (VkImage)(((this->m_imageDst).
                               super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>
                               .m_data.ptr)->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                             m_data.object.m_internal,VVar1,
                    (this->super_LoadStoreTestInstance).super_BaseTestInstance.m_format,
                    subresourceRange_00);
      makeVkSharedPtr<vk::Handle<(vk::HandleType)13>>
                ((image *)&local_1d8,(Move<vk::Handle<(vk::HandleType)13>_> *)&local_50);
      de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::operator=
                ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_> *)
                 ((long)&((this->m_allDstImageViews).
                          super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_ptr + uVar7),
                 (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_> *)&local_1d8);
      uVar4 = local_160;
      de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::release
                ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_> *)&local_1d8);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase(&local_50);
      uVar7 = uVar7 + 0x10;
    }
  }
  else {
    VVar1 = mapImageViewType((this->super_LoadStoreTestInstance).super_BaseTestInstance.m_texture.
                             m_type);
    makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&local_b0,vk,device,
                      (VkDescriptorPool)
                      (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data
                      .object.m_internal,
                      (VkDescriptorSetLayout)
                      (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.
                      m_data.object.m_internal);
    makeVkSharedPtr<vk::Handle<(vk::HandleType)22>>
              ((image *)&local_1d8,(Move<vk::Handle<(vk::HandleType)22>_> *)&local_b0);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>::operator=
              ((this->m_allDescriptorSets).
               super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_> *)&local_1d8);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>::~SharedPtr
              ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_> *)&local_1d8);
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase(&local_b0);
    local_108 = 1;
    uStack_100 = 1;
    subresourceRange_01.levelCount = 1;
    subresourceRange_01.baseArrayLayer = 0;
    subresourceRange_01.aspectMask = 1;
    subresourceRange_01.baseMipLevel = 0;
    subresourceRange_01.layerCount = numDescriptors;
    local_f8 = numDescriptors;
    makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)&local_d0,vk,device,
                  (VkImage)(((this->m_imageSrc).
                             super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>
                             .m_data.ptr)->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                           m_data.object.m_internal,VVar1,
                  (this->super_LoadStoreTestInstance).super_BaseTestInstance.m_format,
                  subresourceRange_01);
    makeVkSharedPtr<vk::Handle<(vk::HandleType)13>>
              ((image *)&local_1d8,(Move<vk::Handle<(vk::HandleType)13>_> *)&local_d0);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::operator=
              ((this->m_allSrcImageViews).
               super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_> *)&local_1d8);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::release
              ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_> *)&local_1d8);
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase(&local_d0);
    local_128 = 1;
    uStack_120 = 1;
    subresourceRange_02.levelCount = 1;
    subresourceRange_02.baseArrayLayer = 0;
    subresourceRange_02.aspectMask = 1;
    subresourceRange_02.baseMipLevel = 0;
    subresourceRange_02.layerCount = numDescriptors;
    local_118 = numDescriptors;
    makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)&local_f0,vk,device,
                  (VkImage)(((this->m_imageDst).
                             super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>
                             .m_data.ptr)->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                           m_data.object.m_internal,VVar1,
                  (this->super_LoadStoreTestInstance).super_BaseTestInstance.m_format,
                  subresourceRange_02);
    makeVkSharedPtr<vk::Handle<(vk::HandleType)13>>
              ((image *)&local_1d8,(Move<vk::Handle<(vk::HandleType)13>_> *)&local_f0);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::operator=
              ((this->m_allDstImageViews).
               super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_> *)&local_1d8);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>::release
              ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_> *)&local_1d8);
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::~RefBase(&local_f0);
  }
  return (VkDescriptorSetLayout)
         (local_168->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.m_internal;
}

Assistant:

VkDescriptorSetLayout ImageLoadStoreTestInstance::prepareDescriptors (void)
{
	const VkDevice			device	= m_context.getDevice();
	const DeviceInterface&	vk		= m_context.getDeviceInterface();

	const int numLayers = m_texture.numLayers();
	m_descriptorSetLayout = DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, VK_SHADER_STAGE_COMPUTE_BIT)
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, VK_SHADER_STAGE_COMPUTE_BIT)
		.build(vk, device);

	m_descriptorPool = DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, numLayers)
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, numLayers)
		.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, numLayers);

	if (m_singleLayerBind)
	{
		for (int layerNdx = 0; layerNdx < numLayers; ++layerNdx)
		{
			const VkImageViewType viewType = mapImageViewType(getImageTypeForSingleLayer(m_texture.type()));
			const VkImageSubresourceRange subresourceRange = makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, layerNdx, 1u);

			m_allDescriptorSets[layerNdx] = makeVkSharedPtr(makeDescriptorSet(vk, device, *m_descriptorPool, *m_descriptorSetLayout));
			m_allSrcImageViews[layerNdx]  = makeVkSharedPtr(makeImageView(vk, device, m_imageSrc->get(), viewType, m_format, subresourceRange));
			m_allDstImageViews[layerNdx]  = makeVkSharedPtr(makeImageView(vk, device, m_imageDst->get(), viewType, m_format, subresourceRange));
		}
	}
	else // bind all layers at once
	{
		const VkImageViewType viewType = mapImageViewType(m_texture.type());
		const VkImageSubresourceRange subresourceRange = makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, numLayers);

		m_allDescriptorSets[0] = makeVkSharedPtr(makeDescriptorSet(vk, device, *m_descriptorPool, *m_descriptorSetLayout));
		m_allSrcImageViews[0]  = makeVkSharedPtr(makeImageView(vk, device, m_imageSrc->get(), viewType, m_format, subresourceRange));
		m_allDstImageViews[0]  = makeVkSharedPtr(makeImageView(vk, device, m_imageDst->get(), viewType, m_format, subresourceRange));
	}

	return *m_descriptorSetLayout;  // not passing the ownership
}